

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

Instr * __thiscall Lowerer::LowerGetNewScObject(Lowerer *this,Instr *instr)

{
  Instr *pIVar1;
  RegOpnd *resultObjOpnd;
  RegOpnd *constructorReturnOpnd;
  RegOpnd *newObjOpnd;
  code *pcVar2;
  bool bVar3;
  OpndKind OVar4;
  undefined4 *puVar5;
  
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x13a7,"(instr)","instr");
    if (!bVar3) goto LAB_005a5efa;
    *puVar5 = 0;
  }
  if (instr->m_opcode != GetNewScObject) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x13a8,"(instr->m_opcode == Js::OpCode::GetNewScObject)",
                       "instr->m_opcode == Js::OpCode::GetNewScObject");
    if (!bVar3) goto LAB_005a5efa;
    *puVar5 = 0;
  }
  if (instr->m_dst == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x13a9,"(instr->GetDst())","instr->GetDst()");
    if (!bVar3) goto LAB_005a5efa;
    *puVar5 = 0;
  }
  if (instr->m_src1 == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x13aa,"(instr->GetSrc1())","instr->GetSrc1()");
    if (!bVar3) goto LAB_005a5efa;
    *puVar5 = 0;
  }
  if (instr->m_src2 == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x13ab,"(instr->GetSrc2())","instr->GetSrc2()");
    if (!bVar3) goto LAB_005a5efa;
    *puVar5 = 0;
  }
  pIVar1 = instr->m_prev;
  if (pIVar1 == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x13ae,"(instrPrev)","instrPrev");
    if (!bVar3) goto LAB_005a5efa;
    *puVar5 = 0;
  }
  resultObjOpnd = (RegOpnd *)instr->m_dst;
  OVar4 = IR::Opnd::GetKind((Opnd *)resultObjOpnd);
  if (OVar4 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar3) goto LAB_005a5efa;
    *puVar5 = 0;
  }
  constructorReturnOpnd = (RegOpnd *)instr->m_src1;
  OVar4 = IR::Opnd::GetKind((Opnd *)constructorReturnOpnd);
  if (OVar4 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar3) goto LAB_005a5efa;
    *puVar5 = 0;
  }
  newObjOpnd = (RegOpnd *)instr->m_src2;
  OVar4 = IR::Opnd::GetKind((Opnd *)newObjOpnd);
  if (OVar4 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar3) {
LAB_005a5efa:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  LowerGetNewScObjectCommon(this,resultObjOpnd,constructorReturnOpnd,newObjOpnd,instr);
  IR::Instr::Remove(instr);
  return pIVar1;
}

Assistant:

IR::Instr *
Lowerer::LowerGetNewScObject(IR::Instr *instr)
{
    Assert(instr);
    Assert(instr->m_opcode == Js::OpCode::GetNewScObject);
    Assert(instr->GetDst());
    Assert(instr->GetSrc1());
    Assert(instr->GetSrc2());

    const auto instrPrev = instr->m_prev;
    Assert(instrPrev);

    LowerGetNewScObjectCommon(
        instr->GetDst()->AsRegOpnd(),
        instr->GetSrc1()->AsRegOpnd(),
        instr->GetSrc2()->AsRegOpnd(),
        instr);
    instr->Remove();

    return instrPrev;
}